

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_what(wchar_t x,wchar_t y,int *a,wchar_t *c)

{
  term_win *ptVar1;
  errr eVar2;
  
  eVar2 = -1;
  if ((((L'\xffffffff' < x) && (x < Term->wid)) && (L'\xffffffff' < y)) && (y < Term->hgt)) {
    ptVar1 = Term->scr;
    *a = ptVar1->a[(uint)y][(uint)x];
    *c = ptVar1->c[(uint)y][(uint)x];
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

errr Term_what(int x, int y, int *a, wchar_t *c)
{
	int w = Term->wid;
	int h = Term->hgt;

	/* Verify location */
	if ((x < 0) || (x >= w)) return (-1);
	if ((y < 0) || (y >= h)) return (-1);

	/* Direct access */
	(*a) = Term->scr->a[y][x];
	(*c) = Term->scr->c[y][x];

	/* Success */
	return (0);
}